

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

WaiterList * __thiscall Js::SharedArrayBuffer::GetWaiterList(SharedArrayBuffer *this,uint index)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *pHVar3;
  BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  WaiterList *this_01;
  undefined4 *puVar4;
  TrackAllocData local_b0;
  WaiterList *local_88;
  WaiterList *waiters;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_50;
  AutoCriticalSection local_28;
  AutoCriticalSection autoCS;
  uint index_local;
  SharedArrayBuffer *this_local;
  
  autoCS.cs._4_4_ = index;
  if (this->sharedContents == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x17d,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    this_local = (SharedArrayBuffer *)0x0;
  }
  else {
    AutoCriticalSection::AutoCriticalSection(&local_28,(CriticalSection *)csSharedArrayBuffer);
    if (this->sharedContents->indexToWaiterList == (IndexToWaitersMap *)0x0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_50,
                 (type_info *)
                 &JsUtil::
                  BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                 ,0x171);
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_50);
      local_70 = Memory::HeapAllocator::Alloc;
      local_68 = 0;
      this_00 = (BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::HeapAllocator>(0x38,pHVar3,0x350bd0);
      JsUtil::
      BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_00,&Memory::HeapAllocator::Instance,0);
      this->sharedContents->indexToWaiterList = this_00;
    }
    local_88 = (WaiterList *)0x0;
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>
                      (this->sharedContents->indexToWaiterList,(uint *)((long)&autoCS.cs + 4),
                       &local_88);
    if (!bVar2) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_b0,(type_info *)&WaiterList::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                 ,0x177);
      pHVar3 = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_b0);
      this_01 = (WaiterList *)new<Memory::HeapAllocator>(0x48,pHVar3,0x350bd0);
      WaiterList::WaiterList(this_01);
      local_88 = this_01;
      JsUtil::
      BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(this->sharedContents->indexToWaiterList,(uint *)((long)&autoCS.cs + 4),&local_88);
    }
    this_local = (SharedArrayBuffer *)local_88;
    AutoCriticalSection::~AutoCriticalSection(&local_28);
  }
  return (WaiterList *)this_local;
}

Assistant:

WaiterList *SharedArrayBuffer::GetWaiterList(uint index)
    {
        if (sharedContents != nullptr)
        {
            // REVIEW: only lock creating the map and pass the lock to the map?
            //         use one lock per instance?
            AutoCriticalSection autoCS(&csSharedArrayBuffer);

            if (sharedContents->indexToWaiterList == nullptr)
            {
                sharedContents->indexToWaiterList = HeapNew(IndexToWaitersMap, &HeapAllocator::Instance);
            }

            WaiterList * waiters = nullptr;
            if (!sharedContents->indexToWaiterList->TryGetValue(index, &waiters))
            {
                waiters = HeapNew(WaiterList);
                sharedContents->indexToWaiterList->Add(index, waiters);
            }
            return waiters;
        }

        Assert(false);
        return nullptr;
    }